

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
sum_function::evaluate
          (sum_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  bool bVar2;
  iterator this_00;
  reference pbVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  assertion_error *this_01;
  uint uVar5;
  pointer pcVar6;
  double dVar7;
  const_array_range_type cVar8;
  string local_40;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_40);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    pbVar4 = (ppVar1->field_1).value_;
    while (uVar5 = *(byte *)&pbVar4->field_0 & 0xf, uVar5 - 8 < 2) {
      pbVar4 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar4->field_0 + 8);
    }
    if (uVar5 == 0xe) {
      cVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                        ((ppVar1->field_1).value_);
      this_00 = cVar8.first_._M_current;
      if (this_00._M_current == cVar8.last_._M_current._M_current) {
        pcVar6 = (pointer)0x0;
      }
      else {
        pcVar6 = (pointer)0x0;
        do {
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                            (this_00._M_current);
          if (!bVar2) goto LAB_0036c3b9;
          dVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                            (this_00._M_current);
          pcVar6 = (pointer)((double)pcVar6 + dVar7);
          this_00._M_current = this_00._M_current + 1;
        } while (this_00._M_current != cVar8.last_._M_current._M_current);
      }
      local_40._M_dataplus._M_p = pcVar6;
      pbVar4 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               ::create_json<double&>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                           *)context,(double *)&local_40);
      return pbVar4;
    }
  }
LAB_0036c3b9:
  std::error_code::operator=(ec,invalid_type);
  pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar3;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                double sum = 0;
                for (auto& j : arg0.array_range())
                {
                    if (!j.is_number())
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    sum += j.template as<double>();
                }

                return *context.create_json(sum);
            }